

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QStringList * __thiscall QMimeData::formats(QMimeData *this)

{
  bool bVar1;
  QMimeDataPrivate *pQVar2;
  QList<QString> *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QMimeDataStruct *e;
  vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_> *__range1;
  QMimeDataPrivate *d;
  QStringList *list;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_ffffffffffffff88;
  QList<QString> *in_stack_ffffffffffffff90;
  __normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMimeData *)0x3e6fe7);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x3e7013);
  std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>::size(&pQVar2->dataList);
  QList<QString>::reserve(in_RSI,in_stack_00000018);
  local_10._M_current = (QMimeDataStruct *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (QMimeDataStruct *)
       std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>::begin
                 ((vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_> *)
                  in_stack_ffffffffffffff90);
  std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>::end
            ((vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_> *)in_stack_ffffffffffffff90)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
    ::operator*(&local_10);
    QList<QString>::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
    ::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QMimeData::formats() const
{
    Q_D(const QMimeData);
    QStringList list;
    list.reserve(static_cast<int>(d->dataList.size()));
    for (auto &e : d->dataList)
        list += e.format;
    return list;
}